

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::error<char_const*>(ConsoleLogger *this,char **args)

{
  ConsoleLogger *in_RSI;
  char **in_RDI;
  
  if (*(int *)((long)in_RDI + 0x6c) < 4) {
    std::mutex::lock((mutex *)in_RSI);
    if (((ulong)in_RDI[0xd] & 1) != 0) {
      std::operator<<((ostream *)*in_RDI,(string *)(in_RDI + 9));
    }
    std::operator<<((ostream *)*in_RDI,"[X] ");
    print<char_const*>(in_RSI,in_RDI);
    if (((ulong)in_RDI[0xd] & 1) != 0) {
      std::operator<<((ostream *)*in_RDI,"\x1b[0m");
    }
    std::mutex::unlock((mutex *)0x18f277);
  }
  return;
}

Assistant:

void ConsoleLogger::error(const Args&... args)
{
	if (loglevel > 3) return;
	mtx.lock();
	if (colored) out << errorColor;
	out << "[X] ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
}